

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool anon_unknown.dwarf_15f1f15::processSources
               (cmGeneratorTarget *tgt,EvaluatedTargetPropertyEntries *entries,
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *srcs,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *uniqueSrcs,bool debugSources)

{
  pointer pEVar1;
  string *psVar2;
  cmLocalGenerator *this;
  pointer pbVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  cmMakefile *this_00;
  string *psVar7;
  cmSourceFile *this_01;
  string *psVar8;
  cmake *pcVar9;
  ostream *poVar10;
  string *psVar11;
  pointer pEVar12;
  char *pcVar13;
  undefined3 in_register_00000081;
  pointer __v;
  __ireturn_type _Var14;
  byte local_25d;
  allocator<char> local_24d;
  undefined4 local_24c;
  string w;
  string e;
  string fullPath;
  string local_1c8;
  string usedSources;
  
  local_24c = CONCAT31(in_register_00000081,debugSources);
  this_00 = cmTarget::GetMakefile(tgt->Target);
  bVar5 = entries->HadContextSensitiveCondition;
  pEVar1 = (entries->Entries).
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar12 = (entries->Entries).
                 super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar4 = bVar5, pEVar12 != pEVar1;
      pEVar12 = pEVar12 + 1) {
    if (pEVar12->ContextDependent != false) {
      bVar5 = 1;
    }
    psVar7 = cmLinkItem::AsStr_abi_cxx11_(&pEVar12->LinkImplItem->super_cmLinkItem);
    psVar11 = (pEVar12->Values).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (pEVar12->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (psVar11 != psVar2) {
      this_01 = cmMakefile::GetOrCreateSource(this_00,psVar11,false,Ambiguous);
      e._M_dataplus._M_p = (pointer)&e.field_2;
      e._M_string_length = 0;
      e.field_2._M_local_buf[0] = '\0';
      w._M_dataplus._M_p = (pointer)&w.field_2;
      w._M_string_length = 0;
      w.field_2._M_local_buf[0] = '\0';
      psVar8 = cmSourceFile::ResolveFullPath(this_01,&e,&w);
      std::__cxx11::string::string((string *)&fullPath,(string *)psVar8);
      pcVar9 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
      if (w._M_string_length != 0) {
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&usedSources);
        cmake::IssueMessage(pcVar9,AUTHOR_WARNING,&w,(cmListFileBacktrace *)&usedSources);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&usedSources._M_string_length);
      }
      if (fullPath._M_string_length == 0) {
        if (e._M_string_length != 0) {
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&usedSources);
          cmake::IssueMessage(pcVar9,FATAL_ERROR,&e,(cmListFileBacktrace *)&usedSources);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&usedSources._M_string_length);
        }
LAB_003d2369:
        bVar6 = false;
        local_25d = bVar5;
      }
      else {
        if ((psVar7->_M_string_length != 0) &&
           (bVar6 = cmsys::SystemTools::FileIsFullPath(psVar11), !bVar6)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&usedSources);
          if (psVar7->_M_string_length == 0) {
            poVar10 = std::operator<<((ostream *)&usedSources,
                                      "Found relative path while evaluating sources of \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar10 = std::operator<<(poVar10,(string *)psVar8);
            poVar10 = std::operator<<(poVar10,"\":\n  \"");
            poVar10 = std::operator<<(poVar10,(string *)psVar11);
            pcVar13 = "\"\n";
          }
          else {
            poVar10 = std::operator<<((ostream *)&usedSources,"Target \"");
            poVar10 = std::operator<<(poVar10,(string *)psVar7);
            poVar10 = std::operator<<(poVar10,
                                      "\" contains relative path in its INTERFACE_SOURCES:\n  \"");
            poVar10 = std::operator<<(poVar10,(string *)psVar11);
            pcVar13 = "\"";
          }
          std::operator<<(poVar10,pcVar13);
          this = tgt->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usedSources);
          goto LAB_003d2369;
        }
        bVar6 = true;
        std::__cxx11::string::_M_assign((string *)psVar11);
      }
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::~string((string *)&e);
      psVar11 = psVar11 + 1;
      bVar4 = local_25d;
      if (!bVar6) goto LAB_003d2551;
    }
    usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
    usedSources._M_string_length = 0;
    usedSources.field_2._M_local_buf[0] = '\0';
    pbVar3 = (pEVar12->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__v = (pEVar12->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __v != pbVar3; __v = __v + 1) {
      _Var14 = std::__detail::
               _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)uniqueSrcs,__v);
      if (((undefined1  [16])_Var14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)srcs
                   ,__v,&pEVar12->Backtrace);
        if ((char)local_24c != '\0') {
          std::operator+(&w," * ",__v);
          std::operator+(&e,&w,"\n");
          std::__cxx11::string::append((string *)&usedSources);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string((string *)&w);
        }
      }
    }
    if (usedSources._M_string_length != 0) {
      pcVar9 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Used sources for target ",&local_24d);
      psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&fullPath,&local_1c8,psVar11);
      std::operator+(&w,&fullPath,":\n");
      std::operator+(&e,&w,&usedSources);
      cmake::IssueMessage(pcVar9,LOG,&e,&pEVar12->Backtrace);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    std::__cxx11::string::~string((string *)&usedSources);
  }
LAB_003d2551:
  local_25d = bVar4;
  return (bool)(local_25d & 1);
}

Assistant:

bool processSources(cmGeneratorTarget const* tgt,
                    EvaluatedTargetPropertyEntries& entries,
                    std::vector<BT<std::string>>& srcs,
                    std::unordered_set<std::string>& uniqueSrcs,
                    bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = entries.HadContextSensitiveCondition;

  for (EvaluatedTargetPropertyEntry& entry : entries.Entries) {
    if (entry.ContextDependent) {
      contextDependent = true;
    }

    cmLinkImplItem const& item = entry.LinkImplItem;
    std::string const& targetName = item.AsStr();

    for (std::string& src : entry.Values) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string w;
      std::string fullPath = sf->ResolveFullPath(&e, &w);
      cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w, tgt->GetBacktrace());
      }
      if (fullPath.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entry.Values) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry.Backtrace);
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry.Backtrace);
    }
  }
  return contextDependent;
}